

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O3

void __thiscall duckdb::Iterator::FindMinimum(Iterator *this,Node *node)

{
  pointer *ppuVar1;
  idx_t iVar2;
  iterator iVar3;
  byte bVar4;
  long lVar5;
  unsafe_optional_ptr<Node> node_00;
  ulong uVar6;
  uint8_t byte;
  Prefix prefix;
  uint local_3c;
  Prefix local_38;
  
  iVar2 = (node->super_IndexPointer).data;
  bVar4 = (byte)(iVar2 >> 0x38);
  if (2 < (byte)((bVar4 & 0x7f) - 8)) {
    if (bVar4 < 0x82) {
      if ((bVar4 != 2) && (bVar4 != 7)) {
LAB_00c1029d:
        if ((long)iVar2 < 0) {
          this->status = GATE_SET;
          this->nested_depth = '\0';
          this->entered_nested_leaf = true;
        }
        if ((bVar4 & 0x7f) == 1) {
          Prefix::Prefix(&local_38,this->art,(Node)(node->super_IndexPointer).data,false,false);
          lVar5 = CONCAT71(local_38.data._1_7_,(uchar)local_38.data);
          if (*(char *)(lVar5 + (ulong)this->art->prefix_count) != '\0') {
            uVar6 = 0;
            do {
              local_3c = CONCAT31(local_3c._1_3_,*(uchar *)(lVar5 + uVar6));
              iVar3._M_current =
                   (this->current_key).key_bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->current_key).key_bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,iVar3,
                           (uchar *)&local_3c);
              }
              else {
                *iVar3._M_current = *(uchar *)(lVar5 + uVar6);
                ppuVar1 = &(this->current_key).key_bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              lVar5 = CONCAT71(local_38.data._1_7_,(uchar)local_38.data);
              if (this->status == GATE_SET) {
                this->row_id[this->nested_depth] = *(uint8_t *)(lVar5 + uVar6);
                this->nested_depth = this->nested_depth + '\x01';
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < *(byte *)(lVar5 + (ulong)this->art->prefix_count));
          }
          local_3c = 0;
          ::std::deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>>::
          emplace_back<duckdb::Node_const&,int>
                    ((deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>> *)
                     &this->nodes,node,(int *)&local_3c);
          node_00.ptr = local_38.ptr;
        }
        else {
          local_3c = local_3c & 0xffffff00;
          node_00 = GetNextChildInternal<duckdb::Node_const>(this->art,node,(uint8_t *)&local_3c);
          local_38.data._0_1_ = (uchar)local_3c;
          iVar3._M_current =
               (this->current_key).key_bytes.
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->current_key).key_bytes.
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,iVar3,
                       (uchar *)&local_38);
          }
          else {
            *iVar3._M_current = (uchar)local_3c;
            ppuVar1 = &(this->current_key).key_bytes.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          if (this->status == GATE_SET) {
            this->row_id[this->nested_depth] = (uchar)local_3c;
            this->nested_depth = this->nested_depth + '\x01';
          }
          ::std::deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>>::
          emplace_back<duckdb::Node_const&,unsigned_char&>
                    ((deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>> *)
                     &this->nodes,node,(uchar *)&local_3c);
        }
        FindMinimum(this,node_00.ptr);
        return;
      }
    }
    else if ((bVar4 != 0x87) && (bVar4 != 0x82)) goto LAB_00c1029d;
  }
  (this->last_leaf).super_IndexPointer.data = iVar2;
  return;
}

Assistant:

void Iterator::FindMinimum(const Node &node) {
	D_ASSERT(node.HasMetadata());

	// Found the minimum.
	if (node.IsAnyLeaf()) {
		last_leaf = node;
		return;
	}

	// We are passing a gate node.
	if (node.GetGateStatus() == GateStatus::GATE_SET) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		status = GateStatus::GATE_SET;
		entered_nested_leaf = true;
		nested_depth = 0;
	}

	// Traverse the prefix.
	if (node.GetType() == NType::PREFIX) {
		Prefix prefix(art, node);
		for (idx_t i = 0; i < prefix.data[Prefix::Count(art)]; i++) {
			current_key.Push(prefix.data[i]);
			if (status == GateStatus::GATE_SET) {
				row_id[nested_depth] = prefix.data[i];
				nested_depth++;
				D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
			}
		}
		nodes.emplace(node, 0);
		return FindMinimum(*prefix.ptr);
	}

	// Go to the leftmost entry in the current node.
	uint8_t byte = 0;
	auto next = node.GetNextChild(art, byte);
	D_ASSERT(next);

	// Recurse on the leftmost node.
	current_key.Push(byte);
	if (status == GateStatus::GATE_SET) {
		row_id[nested_depth] = byte;
		nested_depth++;
		D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
	}
	nodes.emplace(node, byte);
	FindMinimum(*next);
}